

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O2

int lua_setfenv(lua_State *L,int idx)

{
  TValue *pTVar1;
  int iVar2;
  TValue *pTVar3;
  GCobj *v;
  long lVar4;
  long lVar5;
  
  pTVar3 = index2adr(L,idx);
  pTVar1 = L->top;
  v = (GCobj *)(pTVar1[-1].u64 & 0x7fffffffffff);
  lVar5 = pTVar3->it64 >> 0x2f;
  lVar4 = 0x10;
  if ((lVar5 != -0xd) && (lVar5 != -9)) {
    if (lVar5 != -7) {
      iVar2 = 0;
      goto LAB_0010f3a9;
    }
    lVar4 = 0x48;
  }
  *(GCobj **)((pTVar3->it64 & 0x7fffffffffffU) + lVar4) = v;
  if ((((v->gch).marked & 3) != 0) &&
     (((((GCobj *)(pTVar3->u64 & 0x7fffffffffff))->gch).marked & 4) != 0)) {
    lj_gc_barrierf((global_State *)(L->glref).ptr64,(GCobj *)(pTVar3->u64 & 0x7fffffffffff),v);
  }
  pTVar1 = L->top;
  iVar2 = 1;
LAB_0010f3a9:
  L->top = pTVar1 + -1;
  return iVar2;
}

Assistant:

LUA_API int lua_setfenv(lua_State *L, int idx)
{
  cTValue *o = index2adr_check(L, idx);
  GCtab *t;
  lj_checkapi_slot(1);
  lj_checkapi(tvistab(L->top-1), "top stack slot is not a table");
  t = tabV(L->top-1);
  if (tvisfunc(o)) {
    setgcref(funcV(o)->c.env, obj2gco(t));
  } else if (tvisudata(o)) {
    setgcref(udataV(o)->env, obj2gco(t));
  } else if (tvisthread(o)) {
    setgcref(threadV(o)->env, obj2gco(t));
  } else {
    L->top--;
    return 0;
  }
  lj_gc_objbarrier(L, gcV(o), t);
  L->top--;
  return 1;
}